

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

int pageant_delete_key(pageant_pubkey *key,char **retstr)

{
  uint uVar1;
  PageantClientOp *pco;
  char *pcVar2;
  
  pco = pageant_client_op_new();
  if (key->ssh_version == 1) {
    BinarySink_put_byte(pco->binarysink_,'\b');
    BinarySink_put_data(pco->binarysink_,key->blob->s,key->blob->len);
  }
  else {
    BinarySink_put_byte(pco->binarysink_,'\x12');
    BinarySink_put_string(pco->binarysink_,key->blob->s,key->blob->len);
  }
  uVar1 = pageant_client_op_query(pco);
  pageant_client_op_free(pco);
  if (uVar1 != 6) {
    pcVar2 = dupstr("Agent failed to delete key");
  }
  else {
    pcVar2 = (char *)0x0;
  }
  *retstr = pcVar2;
  return (uint)(uVar1 != 6);
}

Assistant:

int pageant_delete_key(struct pageant_pubkey *key, char **retstr)
{
    PageantClientOp *pco = pageant_client_op_new();

    if (key->ssh_version == 1) {
        put_byte(pco, SSH1_AGENTC_REMOVE_RSA_IDENTITY);
        put_data(pco, key->blob->s, key->blob->len);
    } else {
        put_byte(pco, SSH2_AGENTC_REMOVE_IDENTITY);
        put_string(pco, key->blob->s, key->blob->len);
    }

    unsigned reply = pageant_client_op_query(pco);
    pageant_client_op_free(pco);

    if (reply != SSH_AGENT_SUCCESS) {
        *retstr = dupstr("Agent failed to delete key");
        return PAGEANT_ACTION_FAILURE;
    } else {
        *retstr = NULL;
        return PAGEANT_ACTION_OK;
    }
}